

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

arima_object arima_init(int p,int d,int q,int N)

{
  uint uVar1;
  arima_object paVar2;
  long lVar3;
  uint uVar4;
  
  if ((-1 < (d | p | q)) && (0 < N)) {
    uVar4 = q + p;
    lVar3 = (long)(int)((N - d) + uVar4);
    uVar1 = (d < 1) + uVar4;
    paVar2 = (arima_object)malloc(((ulong)uVar1 * (ulong)uVar1 + lVar3) * 8 + 0x78);
    paVar2->p = p;
    paVar2->d = d;
    paVar2->q = q;
    paVar2->N = N;
    paVar2->Nused = N - d;
    paVar2->M = (uint)(d < 1);
    paVar2->retval = 0;
    paVar2->cssml = 1;
    if (0 < (int)uVar4) {
      memset(paVar2 + 1,0,(ulong)(uVar4 - 1) * 8 + 8);
    }
    paVar2->phi = (double *)(paVar2 + 1);
    paVar2->theta = (double *)(&paVar2[1].N + (ulong)(uint)p * 2);
    paVar2->res = (double *)(&paVar2[1].N + (ulong)uVar4 * 2);
    paVar2->vcov = (double *)(&paVar2[1].N + lVar3 * 2);
    paVar2->method = 0;
    paVar2->optmethod = 5;
    paVar2->mean = 0.0;
    paVar2->var = 1.0;
    paVar2->lvcov = uVar1 * uVar1;
    paVar2->ncoeff = uVar1;
    return paVar2;
  }
  puts("\n Input Values cannot be Negative. Program Exiting. ");
  exit(-1);
}

Assistant:

arima_object arima_init(int p, int d, int q, int N) {
	arima_object obj = NULL;
	int i,M;

	if (d > 0) {
		M = 0;
	}
	else {
		M = 1;
	}
	if (p < 0 || d < 0 || q < 0 || N <= 0) {
		printf("\n Input Values cannot be Negative. Program Exiting. \n");
		exit(-1);
	}
	//retval = 0 Input Error
	// retval = 1 Probable Success
	// retval = 4 Optimization Routine didn't converge
	// Retval = 15 Optimization Routine Encountered Inf/Nan Values
	
	obj = (arima_object)malloc(sizeof(struct arima_set) + sizeof(double) * (p+q+N-d) + sizeof(double) * (p+q+M)*(p+q+M));

	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->N = N;
	obj->Nused = N - d;
	obj->M = M;
	obj->retval = 0;
	obj->cssml = 1;

	for (i = 0; i < p + q; ++i) {
		obj->params[i] = 0.0;
	}
	obj->phi = &obj->params[0];
	obj->theta = &obj->params[p];
	obj->res = &obj->params[p + q];
	obj->vcov = &obj->params[p + q + N - d];

	obj->method = 0;// 0 - MLE, 1 - CSS, 2 - Box-Jenkins
	obj->optmethod = 5; // Default Method is 5
	obj->mean = 0.0;
	obj->var = 1.0;
	obj->lvcov = (p + q + M)*(p + q + M);
	obj->ncoeff = p + q + M;

	return obj;
}